

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRefEq(FunctionValidator *this,RefEq *curr)

{
  bool bVar1;
  Shareability left;
  Shareability right;
  Module *pMVar2;
  HeapType local_58;
  HeapType local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  uintptr_t local_38;
  uintptr_t local_30;
  HeapType local_28;
  Type local_20;
  Type eqref;
  RefEq *curr_local;
  FunctionValidator *this_local;
  
  eqref.id = (uintptr_t)curr;
  HeapType::HeapType(&local_28,eq);
  wasm::Type::Type(&local_20,local_28,Nullable,Inexact);
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::RefEq*>(this,bVar1,(RefEq *)eqref.id,"ref.eq requires gc [--enable-gc]");
  local_30 = *(uintptr_t *)(*(long *)(eqref.id + 0x10) + 8);
  local_38 = local_20.id;
  shouldBeSubTypeIgnoringShared
            (this,(Type)local_30,local_20,*(Expression **)(eqref.id + 0x10),
             "ref.eq\'s left argument should be a subtype of eqref");
  local_40 = *(uintptr_t *)(*(long *)(eqref.id + 0x18) + 8);
  local_48 = local_20.id;
  shouldBeSubTypeIgnoringShared
            (this,(Type)local_40,local_20,*(Expression **)(eqref.id + 0x18),
             "ref.eq\'s right argument should be a subtype of eqref");
  bVar1 = wasm::Type::isRef((Type *)(*(long *)(eqref.id + 0x10) + 8));
  if ((bVar1) && (bVar1 = wasm::Type::isRef((Type *)(*(long *)(eqref.id + 0x18) + 8)), bVar1)) {
    local_50 = wasm::Type::getHeapType((Type *)(*(long *)(eqref.id + 0x10) + 8));
    left = HeapType::getShared(&local_50);
    local_58 = wasm::Type::getHeapType((Type *)(*(long *)(eqref.id + 0x18) + 8));
    right = HeapType::getShared(&local_58);
    shouldBeEqual<wasm::RefEq*,wasm::Shareability>
              (this,left,right,(RefEq *)eqref.id,"ref.eq operands must have the same shareability");
  }
  return;
}

Assistant:

void FunctionValidator::visitRefEq(RefEq* curr) {
  Type eqref = Type(HeapType::eq, Nullable);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.eq requires gc [--enable-gc]");
  shouldBeSubTypeIgnoringShared(
    curr->left->type,
    eqref,
    curr->left,
    "ref.eq's left argument should be a subtype of eqref");
  shouldBeSubTypeIgnoringShared(
    curr->right->type,
    eqref,
    curr->right,
    "ref.eq's right argument should be a subtype of eqref");
  if (curr->left->type.isRef() && curr->right->type.isRef()) {
    shouldBeEqual(curr->left->type.getHeapType().getShared(),
                  curr->right->type.getHeapType().getShared(),
                  curr,
                  "ref.eq operands must have the same shareability");
  }
}